

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O1

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,RangeSelectExpression *param_1)

{
  SourceLocation SVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x20);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"RangeSelectExpression not supported for hgdb expression","");
  SVar1 = *this->loc_;
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_004e9040;
  *(SourceLocation *)(this_00 + 0x10) = SVar1;
  this_00[0x18] = (runtime_error)0x1;
  __cxa_throw(this_00,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void handle(const slang::ast::RangeSelectExpression &) {
        throw NotSupportedException("RangeSelectExpression not supported for hgdb expression",
                                    loc_);
    }